

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall
vmips::Binary::replace
          (Binary *this,shared_ptr<vmips::VirtReg> *reg,shared_ptr<vmips::VirtReg> *target)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<vmips::VirtReg> *target_local;
  shared_ptr<vmips::VirtReg> *reg_local;
  Binary *this_local;
  
  peVar2 = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->lhs);
  peVar3 = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)reg);
  bVar1 = VirtReg::operator==(peVar2,peVar3);
  if (bVar1) {
    std::shared_ptr<vmips::VirtReg>::operator=(&this->lhs,target);
  }
  peVar2 = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->rhs);
  peVar3 = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)reg);
  bVar1 = VirtReg::operator==(peVar2,peVar3);
  if (bVar1) {
    std::shared_ptr<vmips::VirtReg>::operator=(&this->rhs,target);
  }
  return;
}

Assistant:

void Binary::replace(const std::shared_ptr<VirtReg> &reg, const std::shared_ptr<VirtReg> &target) {
    if (*lhs == *reg) lhs = target;
    if (*rhs == *reg) rhs = target;
}